

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyHttpImplPrivate::setCachingEnabled(QNetworkReplyHttpImplPrivate *this,bool enable)

{
  QAbstractNetworkCache *pQVar1;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    if (this->cacheEnabled == true) {
      if (enable) goto LAB_0021cbb2;
LAB_0021cc01:
      local_30[0] = '\x02';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[7] = '\0';
      local_30[8] = '\0';
      local_30[9] = '\0';
      local_30[10] = '\0';
      local_30[0xb] = '\0';
      local_30[0xc] = '\0';
      local_30[0xd] = '\0';
      local_30[0xe] = '\0';
      local_30[0xf] = '\0';
      local_30[0x10] = '\0';
      local_30[0x11] = '\0';
      local_30[0x12] = '\0';
      local_30[0x13] = '\0';
      local_30[0x14] = '\0';
      local_30[0x15] = '\0';
      local_30[0x16] = '\0';
      local_30[0x17] = '\0';
      local_18 = "default";
      QMessageLogger::debug
                (local_30,
                 "QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false)")
      ;
      pQVar1 = this->managerPrivate->networkCache;
      (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&(this->super_QNetworkReplyPrivate).url);
      this->cacheSaveDevice = (QIODevice *)0x0;
      this->cacheEnabled = false;
    }
  }
  else {
LAB_0021cbb2:
    if (this->cacheEnabled == false) {
      if (!enable) goto LAB_0021cc01;
      if (this->bytesDownloaded == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          createCache(this);
          return;
        }
        goto LAB_0021cc84;
      }
      setCachingEnabled((QNetworkReplyHttpImplPrivate *)&this->bytesDownloaded);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0021cc84:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::setCachingEnabled(bool enable)
{
    if (!enable && !cacheEnabled)
        return;                 // nothing to do
    if (enable && cacheEnabled)
        return;                 // nothing to do either!

    if (enable) {
        if (Q_UNLIKELY(bytesDownloaded)) {
            qDebug() << "setCachingEnabled: " << bytesDownloaded << " bytesDownloaded";
            // refuse to enable in this case
            qCritical("QNetworkReplyImpl: backend error: caching was enabled after some bytes had been written");
            return;
        }

        createCache();
    } else {
        // someone told us to turn on, then back off?
        // ok... but you should make up your mind
        qDebug("QNetworkReplyImpl: setCachingEnabled(true) called after setCachingEnabled(false)");
        managerPrivate->networkCache->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}